

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::MatchLiteralInst::Exec
          (MatchLiteralInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  ulong uVar1;
  Char *pCVar2;
  Char *pCVar3;
  uint uVar4;
  uint uVar5;
  Type pRVar6;
  long lVar7;
  code *pcVar8;
  bool bVar9;
  undefined4 *puVar10;
  ulong uVar11;
  Char *pCVar12;
  
  if ((((matcher->program).ptr)->rep).insts.litbufLen - (this->super_LiteralMixin).offset <
      (this->super_LiteralMixin).length) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x64c,"(length <= matcher.program->rep.insts.litbufLen - offset)",
                       "length <= matcher.program->rep.insts.litbufLen - offset");
    if (!bVar9) {
      pcVar8 = (code *)invalidInstructionException();
      (*pcVar8)();
    }
    *puVar10 = 0;
  }
  uVar4 = (this->super_LiteralMixin).length;
  uVar5 = *inputOffset;
  if (uVar4 <= inputLength - uVar5) {
    pRVar6 = matcher->stats;
    lVar7 = *(long *)((long)&((matcher->program).ptr)->rep + 0x10);
    uVar11 = (ulong)(this->super_LiteralMixin).offset;
    pCVar2 = (Char *)(lVar7 + uVar11 * 2);
    if (pRVar6 != (Type)0x0) {
      pRVar6->numCompares = pRVar6->numCompares + 1;
    }
    if (*pCVar2 == input[uVar5]) {
      pCVar12 = (Char *)(lVar7 + uVar11 * 2);
      uVar11 = (ulong)uVar5 * 2 + 2;
      do {
        pCVar12 = pCVar12 + 1;
        if (pCVar2 + uVar4 <= pCVar12) {
          *inputOffset = (CharCount)(uVar11 >> 1);
          *instPointer = *instPointer + 9;
          return false;
        }
        if (pRVar6 != (Type)0x0) {
          pRVar6->numCompares = pRVar6->numCompares + 1;
        }
        uVar1 = uVar11 + 2;
        pCVar3 = (Char *)((long)input + uVar11);
        uVar11 = uVar1;
      } while (*pCVar12 == *pCVar3);
      *inputOffset = (CharCount)(uVar1 >> 1);
    }
    else {
      *inputOffset = uVar5 + 1;
    }
  }
  bVar9 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
  return bVar9;
}

Assistant:

inline bool MatchLiteralInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        Assert(length <= matcher.program->rep.insts.litbufLen - offset);

        if (length > inputLength - inputOffset)
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }

        const Char *const literalBuffer = matcher.program->rep.insts.litbuf;
        const Char * literalCurr = literalBuffer + offset;
        const Char * inputCurr = input + inputOffset;

#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (*literalCurr != *inputCurr)
        {
            inputOffset++;
            return matcher.Fail(FAIL_PARAMETERS);
        }

        const Char *const literalEnd = literalCurr + length;
        literalCurr++;
        inputCurr++;

        while (literalCurr < literalEnd)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.CompStats();
#endif
            if (*literalCurr != *inputCurr++)
            {
                inputOffset = (CharCount)(inputCurr - input);
                return matcher.Fail(FAIL_PARAMETERS);
            }
            literalCurr++;
        }

        inputOffset = (CharCount)(inputCurr - input);
        instPointer += sizeof(*this);
        return false;
    }